

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-map.c
# Opt level: O1

void grid_data_as_text(grid_data *g,int *ap,wchar_t *cp,int *tap,wchar_t *tcp)

{
  grid_light_level gVar1;
  wchar_t wVar2;
  ulong uVar3;
  monster_race *pmVar4;
  _Bool _Var5;
  byte bVar6;
  byte bVar7;
  wchar_t wVar8;
  uint32_t uVar9;
  monster *pmVar10;
  ulong uVar11;
  int n;
  uint uVar12;
  uint uVar13;
  object_kind **ppoVar14;
  int attr;
  object_kind *poVar15;
  uint uVar16;
  
  bVar7 = feat_x_attr[g->lighting][f_info[g->f_idx].fidx];
  wVar8 = feat_x_char[g->lighting][f_info[g->f_idx].fidx];
  uVar16 = (uint)bVar7;
  if (use_graphics == L'\0') {
    uVar12 = bVar7 & 0x7f;
    _Var5 = feat_is_torch(g->f_idx);
    if (_Var5) {
      gVar1 = g->lighting;
      if (gVar1 == LIGHTING_DARK) {
        attr = 5;
        n = 2;
      }
      else {
        if (gVar1 == LIGHTING_LIT) {
          attr = 5;
        }
        else {
          if ((gVar1 != LIGHTING_TORCH) || (_Var5 = outside(), _Var5)) goto LAB_001f40eb;
          attr = 4;
        }
        n = 1;
      }
      bVar6 = get_color((uint8_t)uVar12,attr,n);
      uVar12 = (uint)bVar6;
    }
LAB_001f40eb:
    uVar12 = bVar7 & 0xffffff80 | uVar12;
    uVar16 = uVar12;
    if ((use_graphics == L'\0') && (_Var5 = feat_is_wall(g->f_idx), _Var5)) {
      if ((player->opts).opt[0xc] == true) {
        uVar16 = uVar12 | 0x200;
      }
      else {
        uVar16 = uVar12 + 0x100;
        if ((player->opts).opt[0xb] == false) {
          uVar16 = uVar12;
        }
      }
    }
  }
  *tap = uVar16;
  *tcp = wVar8;
  if ((g->trap != (trap *)0x0) && (g->hallucinate == false)) {
    _Var5 = flag_has_dbg(g->trap->flags,3,3,"g->trap->flags","TRF_VISIBLE");
    if ((_Var5) ||
       (((_Var5 = flag_has_dbg(g->trap->flags,3,1,"g->trap->flags","TRF_GLYPH"), _Var5 ||
         (_Var5 = flag_has_dbg(g->trap->flags,3,0x10,"g->trap->flags","TRF_M_TRAP"), _Var5)) ||
        (_Var5 = flag_has_dbg(g->trap->flags,3,0xf,"g->trap->flags","TRF_WEB"), _Var5)))) {
      wVar8 = g->trap->kind->tidx;
      uVar16 = (uint)trap_x_attr[g->lighting][wVar8];
      wVar8 = trap_x_char[g->lighting][wVar8];
    }
    _Var5 = flag_has_dbg(g->trap->flags,3,0xf,"g->trap->flags","TRF_WEB");
    if (!_Var5) goto LAB_001f4253;
    goto LAB_001f428b;
  }
LAB_001f4253:
  if (g->unseen_money == true) {
    ppoVar14 = &unknown_gold_kind;
LAB_001f4275:
    bVar7 = object_kind_attr(*ppoVar14);
    poVar15 = *ppoVar14;
LAB_001f4284:
    uVar16 = (uint)bVar7;
    wVar8 = object_kind_char(poVar15);
  }
  else {
    if (g->unseen_object == true) {
      ppoVar14 = &unknown_item_kind;
      goto LAB_001f4275;
    }
    if (g->first_kind != (object_kind *)0x0) {
      if (g->hallucinate == true) {
        do {
          do {
            poVar15 = k_info;
            uVar9 = Rand_div(z_info->k_max - 1);
          } while (poVar15[(long)(int)uVar9 + 1].name == (char *)0x0);
          uVar12 = poVar15[(long)(int)uVar9 + 1].kidx;
          uVar16 = (uint)kind_x_attr[uVar12];
          wVar8 = kind_x_char[uVar12];
        } while (wVar8 == L'\0' || kind_x_attr[uVar12] == 0);
        goto LAB_001f428b;
      }
      if (g->multiple_objects == true) {
        ppoVar14 = &pile_kind;
        goto LAB_001f4275;
      }
      bVar7 = object_kind_attr(g->first_kind);
      poVar15 = g->first_kind;
      goto LAB_001f4284;
    }
  }
LAB_001f428b:
  if (g->m_idx == L'\0') {
    if (g->is_player != true) goto LAB_001f44f8;
    uVar11 = (ulong)r_info->ridx;
    uVar16 = (uint)monster_x_attr[uVar11];
    if (((player->opts).opt[0x12] == true) && (-1 < (char)monster_x_attr[uVar11])) {
      uVar3 = (long)(player->chp * 10) / (long)(int)player->mhp;
      uVar16 = 1;
      if ((uint)uVar3 < 9) {
        uVar16 = *(uint *)(&DAT_002414d4 + (uVar3 & 0xffffffff) * 4);
      }
    }
  }
  else {
    if (g->hallucinate != true) {
      pmVar10 = cave_monster(cave,g->m_idx);
      _Var5 = monster_is_camouflaged(pmVar10);
      if (!_Var5) {
        pmVar10 = cave_monster(cave,g->m_idx);
        uVar12 = pmVar10->race->ridx;
        bVar7 = monster_x_attr[uVar12];
        uVar13 = (uint)bVar7;
        wVar2 = monster_x_char[uVar12];
        if (-1 < (char)bVar7) {
          if (((player->opts).opt[0x10] == true) &&
             (_Var5 = monster_is_shape_unique(pmVar10), _Var5)) {
            uVar13 = 0x11;
          }
          else {
            _Var5 = flag_has_dbg(pmVar10->race->flags,0xc,10,"mon->race->flags","RF_ATTR_MULTI");
            if (((_Var5) ||
                (_Var5 = flag_has_dbg(pmVar10->race->flags,0xc,0xb,"mon->race->flags",
                                      "RF_ATTR_FLICKER"), _Var5)) ||
               (_Var5 = flag_has_dbg(pmVar10->race->flags,0xc,8,"mon->race->flags","RF_ATTR_RAND"),
               _Var5)) {
              uVar13 = (uint)bVar7;
              if (pmVar10->attr != 0) {
                uVar13 = (uint)pmVar10->attr;
              }
            }
            else {
              _Var5 = flags_test(pmVar10->race->flags,0xc,9,7,0);
              if (_Var5) {
                if (((-1 < (char)uVar16) &&
                    (_Var5 = flag_has_dbg(pmVar10->race->flags,0xc,7,"mon->race->flags",
                                          "RF_CHAR_CLEAR"), uVar13 = uVar16, _Var5)) &&
                   (_Var5 = flag_has_dbg(pmVar10->race->flags,0xc,9,"mon->race->flags",
                                         "RF_ATTR_CLEAR"), wVar2 = wVar8, uVar13 = (uint)bVar7,
                   _Var5)) {
                  uVar13 = uVar16;
                }
              }
              else {
                wVar2 = monster_x_char[pmVar10->race->ridx];
              }
            }
          }
        }
        uVar16 = uVar13;
        wVar8 = wVar2;
        pmVar10->attr = (uint8_t)uVar16;
      }
      goto LAB_001f44f8;
    }
    do {
      pmVar4 = r_info;
      uVar9 = Rand_div((uint)z_info->r_max);
    } while (pmVar4[(int)uVar9].name == (char *)0x0);
    uVar11 = (ulong)pmVar4[(int)uVar9].ridx;
    uVar16 = (uint)monster_x_attr[uVar11];
  }
  wVar8 = monster_x_char[uVar11];
LAB_001f44f8:
  *ap = uVar16;
  *cp = wVar8;
  return;
}

Assistant:

void grid_data_as_text(struct grid_data *g, int *ap, wchar_t *cp, int *tap,
					   wchar_t *tcp)
{
	struct feature *feat = &f_info[g->f_idx];

	int a = feat_x_attr[g->lighting][feat->fidx];
	wchar_t c = feat_x_char[g->lighting][feat->fidx];
	bool skip_objects = false;

	/* Get the colour for ASCII */
	if (use_graphics == GRAPHICS_NONE)
		grid_get_attr(g, &a);

	/* Save the terrain info for the transparency effects */
	(*tap) = a;
	(*tcp) = c;

	/* There is a trap in this grid, and we are not hallucinating */
	if (g->trap && (!g->hallucinate)) {
	    /* Change graphics to indicate visible traps, skip objects if a web */
	    skip_objects = get_trap_graphics(cave, g, &a, &c);
	}

	if (!skip_objects) {
		/* If there's an object, deal with that. */
		if (g->unseen_money) {

			/* $$$ gets an orange star*/
			a = object_kind_attr(unknown_gold_kind);
			c = object_kind_char(unknown_gold_kind);

		} else if (g->unseen_object) {

			/* Everything else gets a red star */
			a = object_kind_attr(unknown_item_kind);
			c = object_kind_char(unknown_item_kind);

		} else if (g->first_kind) {
			if (g->hallucinate) {
				/* Just pick a random object to display. */
				hallucinatory_object(&a, &c);
			} else if (g->multiple_objects) {
				/* Get the "pile" feature instead */
				a = object_kind_attr(pile_kind);
				c = object_kind_char(pile_kind);
			} else {
				/* Normal attr and char */
				a = object_kind_attr(g->first_kind);
				c = object_kind_char(g->first_kind);
			}
		}
	}

	/* Handle monsters, the player and trap borders */
	if (g->m_idx > 0) {
		if (g->hallucinate) {
			/* Just pick a random monster to display. */
			hallucinatory_monster(&a, &c);
		} else if (!monster_is_camouflaged(cave_monster(cave, g->m_idx)))	{
			struct monster *mon = cave_monster(cave, g->m_idx);

			uint8_t da;
			wchar_t dc;

			/* Desired attr & char */
			da = monster_x_attr[mon->race->ridx];
			dc = monster_x_char[mon->race->ridx];

			/* Special handling of attrs and/or chars */
			if (da & 0x80) {
				/* Special attr/char codes */
				a = da;
				c = dc;
			} else if (OPT(player, purple_uniques) && 
					monster_is_shape_unique(mon)) {
				/* Turn uniques purple if desired (violet, actually) */
				a = COLOUR_VIOLET;
				c = dc;
			} else if (rf_has(mon->race->flags, RF_ATTR_MULTI) ||
					   rf_has(mon->race->flags, RF_ATTR_FLICKER) ||
					   rf_has(mon->race->flags, RF_ATTR_RAND)) {
				/* Multi-hued monster */
				a = mon->attr ? mon->attr : da;
				c = dc;
			} else if (!flags_test(mon->race->flags, RF_SIZE,
								   RF_ATTR_CLEAR, RF_CHAR_CLEAR, FLAG_END)) {
				/* Normal monster (not "clear" in any way) */
				a = da;
				/* Desired attr & char. da is not used, should a be set to it?*/
				/*da = monster_x_attr[mon->race->ridx];*/
				dc = monster_x_char[mon->race->ridx];
				c = dc;
			} else if (a & 0x80) {
				/* Hack -- Bizarre grid under monster */
				a = da;
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_CHAR_CLEAR)) {
				/* Normal char, Clear attr, monster */
				c = dc;
			} else if (!rf_has(mon->race->flags, RF_ATTR_CLEAR)) {
				/* Normal attr, Clear char, monster */
				a = da;
			}

			/* Store the drawing attr so we can use it elsewhere */
			mon->attr = a;
		}
	} else if (g->is_player) {
		struct monster_race *race = &r_info[0];

		/* Get the "player" attr */
		a = monster_x_attr[race->ridx];
		if ((OPT(player, hp_changes_color)) && !(a & 0x80)) {
			switch(player->chp * 10 / player->mhp)
			{
			case 10:
			case  9: 
			{
				a = COLOUR_WHITE; 
				break;
			}
			case  8:
			case  7:
			{
				a = COLOUR_YELLOW;
				break;
			}
			case  6:
			case  5:
			{
				a = COLOUR_ORANGE;
				break;
			}
			case  4:
			case  3:
			{
				a = COLOUR_L_RED;
				break;
			}
			case  2:
			case  1:
			case  0:
			{
				a = COLOUR_RED;
				break;
			}
			default:
			{
				a = COLOUR_WHITE;
				break;
			}
			}
		}

		/* Get the "player" char */
		c = monster_x_char[race->ridx];
	}

	/* Result */
	(*ap) = a;
	(*cp) = c;
}